

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void Test_DeathSTREQ_logging::RunTest(void)

{
  undefined *puVar1;
  int iVar2;
  string *psVar3;
  long *plVar4;
  LogMessageData *pLVar5;
  string *extraout_RAX;
  ostream *poVar6;
  LogMessage local_68;
  undefined1 local_58 [32];
  long local_38 [2];
  
  puVar1 = google::g_logging_fail_func;
  google::g_called_abort = '\0';
  google::g_logging_fail_func = google::CalledAbort;
  iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
  if (iVar2 == 0) {
    psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_((char *)0x0,"this","__null == \"this\"");
    if (psVar3 == (string *)0x0) goto LAB_00117276;
  }
  else {
LAB_00117276:
    if (google::g_called_abort == '\0') {
      google::g_logging_fail_func = puVar1;
      RunTest();
LAB_00117500:
      RunTest();
LAB_00117505:
      RunTest();
LAB_0011750a:
      RunTest();
LAB_0011750f:
      RunTest();
LAB_00117514:
      RunTest();
    }
    else {
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x255);
          poVar6 = google::LogMessage::stream(&local_68);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_0011767c;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_00117500;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_((char *)0x0,"siht","__null == \"siht\"")
        ;
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x256);
          poVar6 = google::LogMessage::stream(&local_68);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_0011767c;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_00117505;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,599);
          poVar6 = google::LogMessage::stream(&local_68);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_0011767c;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_0011750a;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_((char *)0x0,(char *)0x0,"__null != __null")
        ;
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,600);
          poVar6 = google::LogMessage::stream(&local_68);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_0011767c;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_0011750f;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_("this","this","\"this\" != \"this\"");
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x259);
          poVar6 = google::LogMessage::stream(&local_68);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_0011767c;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_00117514;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        local_58._16_8_ = local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 0x10),"a","");
        plVar4 = (long *)std::__cxx11::string::append((char *)(local_58 + 0x10));
        pLVar5 = (LogMessageData *)(plVar4 + 2);
        if ((LogMessageData *)*plVar4 == pLVar5) {
          local_58._0_4_ = pLVar5->preserved_errno_;
          local_58[4] = pLVar5->message_text_[0];
          local_58[5] = pLVar5->message_text_[1];
          local_58[6] = pLVar5->message_text_[2];
          local_58[7] = pLVar5->message_text_[3];
          local_58._8_8_ = plVar4[3];
          local_68.allocated_ = (LogMessageData *)local_58;
        }
        else {
          local_58._0_4_ = pLVar5->preserved_errno_;
          local_58[4] = pLVar5->message_text_[0];
          local_58[5] = pLVar5->message_text_[1];
          local_58[6] = pLVar5->message_text_[2];
          local_58[7] = pLVar5->message_text_[3];
          local_68.allocated_ = (LogMessageData *)*plVar4;
        }
        local_68.data_ = (LogMessageData *)plVar4[1];
        *plVar4 = (long)pLVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_
                           ((char *)local_68.allocated_,"abc",
                            "(string(\"a\")+\"b\").c_str() == \"abc\"");
        if (local_68.allocated_ != (LogMessageData *)local_58) {
          operator_delete(local_68.allocated_,local_58._0_8_ + 1);
        }
        if ((long *)local_58._16_8_ != local_38) {
          operator_delete((void *)local_58._16_8_,local_38[0] + 1);
        }
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x25a);
          poVar6 = google::LogMessage::stream(&local_68);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_0011767c;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort != '\0') {
        return;
      }
    }
    RunTest();
    psVar3 = extraout_RAX;
  }
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x254);
  poVar6 = google::LogMessage::stream(&local_68);
  std::operator<<(poVar6,(string *)psVar3);
LAB_0011767c:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

TEST(DeathSTREQ, logging) {
  ASSERT_DEATH(CHECK_STREQ(NULL, "this"), "");
  ASSERT_DEATH(CHECK_STREQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ(NULL, "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRNE(NULL, NULL), "");
  ASSERT_DEATH(CHECK_STRNE("this", "this"), "");
  ASSERT_DEATH(CHECK_STREQ((string("a")+"b").c_str(), "abc"), "");
}